

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  global_State *pgVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  TValue *pTVar7;
  CallInfo *pCVar8;
  StkId pTVar9;
  int *piVar10;
  int iVar11;
  CallInfo *pCVar12;
  uint uVar13;
  GCObject *pGVar14;
  StkId pTVar15;
  long lVar16;
  ulong uVar17;
  int newsize;
  StkId pTVar18;
  ulong uVar19;
  StkId pTVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  
  iVar11 = func->tt;
  if ((long)iVar11 == 6) {
    pGVar14 = (func->value).gc;
  }
  else {
    pTVar7 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar7->tt != 6) {
      luaG_runerror(L,"attempt to %s a %s value","call",luaT_typenames[iVar11]);
    }
    pTVar9 = L->stack;
    pTVar15 = L->top;
    if (func < pTVar15) {
      do {
        pTVar15->value = pTVar15[-1].value;
        pTVar15->tt = pTVar15[-1].tt;
        pTVar15 = pTVar15 + -1;
      } while (func < pTVar15);
      pTVar15 = L->top;
    }
    if ((long)L->stack_last - (long)pTVar15 < 0x11) {
      iVar11 = L->stacksize;
      iVar25 = iVar11 * 2;
      if (iVar11 < 1) {
        iVar25 = iVar11 + 1;
      }
      luaD_reallocstack(L,iVar25);
      pTVar15 = L->top;
    }
    lVar21 = (long)func - (long)pTVar9;
    L->top = pTVar15 + 1;
    pTVar15 = L->stack;
    pGVar14 = (pTVar7->value).gc;
    *(GCObject **)((long)pTVar15 + lVar21) = pGVar14;
    *(int *)((long)pTVar15 + lVar21 + 8) = pTVar7->tt;
    func = (StkId)(lVar21 + (long)pTVar15);
  }
  pTVar15 = L->stack;
  lVar21 = (long)func - (long)pTVar15;
  pCVar8 = L->ci;
  pCVar8->savedpc = L->savedpc;
  if ((pGVar14->h).flags == '\0') {
    pgVar2 = (pGVar14->th).l_G;
    iVar11 = (uint)*(byte *)((long)&pgVar2->GCthreshold + 1) +
             (uint)*(byte *)((long)&pgVar2->GCthreshold + 3);
    if ((long)L->stack_last - (long)L->top <= (long)(ulong)(uint)(iVar11 * 0x10)) {
      iVar25 = L->stacksize;
      newsize = iVar25 * 2;
      if (iVar25 < iVar11) {
        newsize = iVar25 + iVar11;
      }
      luaD_reallocstack(L,newsize);
      pTVar15 = L->stack;
    }
    pTVar9 = (StkId)((long)pTVar15 + lVar21);
    if (*(char *)((long)&pgVar2->GCthreshold + 2) == '\0') {
      pTVar20 = pTVar9 + 1;
      if (pTVar9 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar9 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1;
      }
    }
    else {
      pTVar20 = L->top;
      bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 1);
      uVar6 = (uint)bVar1;
      iVar11 = (int)((ulong)((long)pTVar20 - (long)pTVar9) >> 4);
      if ((int)(uint)bVar1 < iVar11) {
        uVar13 = iVar11 - 1;
      }
      else {
        iVar11 = (uVar6 - iVar11) + 1;
        do {
          pTVar20->tt = 0;
          pTVar20 = pTVar20 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        L->top = pTVar20;
        uVar13 = uVar6;
      }
      if (uVar6 != 0) {
        lVar16 = 0;
        do {
          pTVar15 = L->top;
          L->top = pTVar15 + 1;
          pTVar15->value = *(Value *)((long)&pTVar20[-(ulong)uVar13].value + lVar16);
          pTVar15->tt = *(int *)((long)&pTVar20[-(ulong)uVar13].tt + lVar16);
          *(undefined4 *)((long)&pTVar20[-(ulong)uVar13].tt + lVar16) = 0;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)bVar1 << 4 != lVar16);
        pTVar15 = L->stack;
      }
      pTVar9 = (StkId)((long)pTVar15 + lVar21);
    }
    if (L->ci == L->end_ci) {
      pCVar8 = growCI(L);
    }
    else {
      pCVar8 = L->ci + 1;
      L->ci = pCVar8;
    }
    pCVar8->func = pTVar9;
    pCVar8->base = pTVar20;
    L->base = pTVar20;
    bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 3);
    pTVar9 = pTVar20 + bVar1;
    pCVar8->top = pTVar9;
    L->savedpc = (Instruction *)pgVar2->ud;
    pCVar8->tailcalls = 0;
    pCVar8->nresults = nresults;
    auVar5 = _DAT_00115030;
    auVar4 = _DAT_00115020;
    auVar3 = _DAT_00115010;
    pTVar15 = L->top;
    if (pTVar15 < pTVar9) {
      pTVar18 = pTVar20 + bVar1;
      if (pTVar20 + bVar1 <= pTVar15 + 1) {
        pTVar18 = pTVar15 + 1;
      }
      uVar17 = (long)&pTVar18->value + ~(ulong)pTVar15;
      auVar24._8_4_ = (int)uVar17;
      auVar24._0_8_ = uVar17;
      auVar24._12_4_ = (int)(uVar17 >> 0x20);
      auVar22._0_8_ = uVar17 >> 4;
      auVar22._8_8_ = auVar24._8_8_ >> 4;
      piVar10 = &pTVar15[3].tt;
      uVar19 = 0;
      auVar22 = auVar22 ^ _DAT_00115030;
      do {
        auVar23._8_4_ = (int)uVar19;
        auVar23._0_8_ = uVar19;
        auVar23._12_4_ = (int)(uVar19 >> 0x20);
        auVar24 = (auVar23 | auVar4) ^ auVar5;
        iVar11 = auVar22._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar11 && auVar22._0_4_ < auVar24._0_4_ ||
                    iVar11 < auVar24._4_4_) & 1)) {
          piVar10[-0xc] = 0;
        }
        if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
            auVar24._12_4_ <= auVar22._12_4_) {
          piVar10[-8] = 0;
        }
        auVar24 = (auVar23 | auVar3) ^ auVar5;
        iVar25 = auVar24._4_4_;
        if (iVar25 <= iVar11 && (iVar25 != iVar11 || auVar24._0_4_ <= auVar22._0_4_)) {
          piVar10[-4] = 0;
          *piVar10 = 0;
        }
        uVar19 = uVar19 + 4;
        piVar10 = piVar10 + 0x10;
      } while (((uVar17 >> 4) + 4 & 0xfffffffffffffffc) != uVar19);
    }
    L->top = pTVar9;
    iVar11 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      iVar11 = L->stacksize;
      iVar25 = iVar11 * 2;
      if (iVar11 < 0x14) {
        iVar25 = iVar11 + 0x14;
      }
      luaD_reallocstack(L,iVar25);
      pCVar8 = L->ci;
    }
    if (pCVar8 == L->end_ci) {
      pCVar8 = growCI(L);
      pCVar12 = L->ci;
    }
    else {
      pCVar8 = pCVar8 + 1;
      L->ci = pCVar8;
      pCVar12 = pCVar8;
    }
    pTVar15 = L->stack;
    pCVar8->func = (StkId)((long)pTVar15 + lVar21);
    pTVar15 = (StkId)((long)pTVar15 + lVar21 + 0x10);
    pCVar8->base = pTVar15;
    L->base = pTVar15;
    pCVar8->top = L->top + 0x14;
    pCVar8->nresults = nresults;
    uVar6 = (*(code *)(((pCVar12->func->value).gc)->h).node)(L);
    if ((int)uVar6 < 0) {
      iVar11 = 2;
    }
    else {
      luaD_poscall(L,L->top + -(ulong)uVar6);
      iVar11 = 1;
    }
  }
  return iVar11;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize+p->numparams);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}